

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::Cond<float>::doPrint
          (Cond<float> *this,ostream *os,BaseArgExprs *args)

{
  ostream *poVar1;
  const_reference ppEVar2;
  BaseArgExprs *args_local;
  ostream *os_local;
  Cond<float> *this_local;
  
  poVar1 = std::operator<<(os,"(");
  ppEVar2 = std::
            vector<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*>_>
            ::operator[](args,0);
  poVar1 = BuiltinPrecisionTests::operator<<(poVar1,*ppEVar2);
  poVar1 = std::operator<<(poVar1," ? ");
  ppEVar2 = std::
            vector<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*>_>
            ::operator[](args,1);
  poVar1 = BuiltinPrecisionTests::operator<<(poVar1,*ppEVar2);
  poVar1 = std::operator<<(poVar1," : ");
  ppEVar2 = std::
            vector<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*>_>
            ::operator[](args,2);
  poVar1 = BuiltinPrecisionTests::operator<<(poVar1,*ppEVar2);
  std::operator<<(poVar1,")");
  return;
}

Assistant:

void	doPrint	(ostream& os, const BaseArgExprs& args) const
	{
		os << "(" << *args[0] << " ? " << *args[1] << " : " << *args[2] << ")";
	}